

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

optional<pbrt::LightLeSample> * __thiscall
pbrt::UniformInfiniteLight::SampleLe
          (optional<pbrt::LightLeSample> *__return_storage_ptr__,UniformInfiniteLight *this,
          Point2f u1,Point2f u2,SampledWavelengths *lambda,Float time)

{
  undefined4 uVar1;
  undefined4 uVar3;
  undefined8 uVar2;
  float fVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  float fVar7;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar8;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  undefined1 in_register_00001208 [56];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar19 [56];
  undefined1 auVar18 [64];
  float fVar20;
  float fVar21;
  float fVar24;
  float fVar25;
  undefined8 in_XMM1_Qb;
  float fVar27;
  undefined1 auVar22 [16];
  undefined1 auVar26 [56];
  undefined1 auVar23 [64];
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  SampledSpectrum SVar40;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_98;
  float fStack_94;
  undefined1 extraout_var [60];
  
  auVar16._8_56_ = in_register_00001208;
  auVar16._0_8_ = u1.super_Tuple2<pbrt::Point2,_float>;
  auVar32 = vmovshdup_avx(auVar16._0_16_);
  fVar8 = auVar32._0_4_ * 6.2831855;
  fVar14 = cosf(fVar8);
  auVar17._0_4_ = sinf(fVar8);
  auVar17._4_60_ = extraout_var;
  local_b8 = u2.super_Tuple2<pbrt::Point2,_float>.x;
  fStack_b4 = u2.super_Tuple2<pbrt::Point2,_float>.y;
  fStack_b0 = (float)in_XMM1_Qb;
  fStack_ac = (float)((ulong)in_XMM1_Qb >> 0x20);
  auVar9._0_4_ = local_b8 + local_b8;
  auVar9._4_4_ = fStack_b4 + fStack_b4;
  auVar9._8_4_ = fStack_b0 + fStack_b0;
  auVar9._12_4_ = fStack_ac + fStack_ac;
  auVar32._8_4_ = 0xbf800000;
  auVar32._0_8_ = 0xbf800000bf800000;
  auVar32._12_4_ = 0xbf800000;
  auVar9 = vaddps_avx512vl(auVar9,auVar32);
  fVar15 = auVar9._0_4_;
  auVar32 = vmovshdup_avx(auVar9);
  fVar8 = auVar32._0_4_;
  if (fVar15 == 0.0) {
    auVar32 = ZEXT816(0) << 0x40;
    if ((fVar8 == 0.0) && (!NAN(fVar8))) goto LAB_00351072;
  }
  auVar10._8_4_ = 0x7fffffff;
  auVar10._0_8_ = 0x7fffffff7fffffff;
  auVar10._12_4_ = 0x7fffffff;
  auVar10 = vandps_avx512vl(auVar9,auVar10);
  auVar33._0_4_ = fVar15 / fVar8;
  auVar33._4_12_ = auVar9._4_12_;
  auVar9 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf490fdb),0),auVar33,ZEXT416(0x3fc90fdb));
  auVar32 = vshufps_avx(auVar10,auVar10,0xf5);
  bVar5 = auVar32._0_4_ < auVar10._0_4_;
  fVar7 = (float)((uint)bVar5 * (int)((fVar8 / fVar15) * 0.7853982) + (uint)!bVar5 * auVar9._0_4_);
  fVar8 = (float)((uint)bVar5 * (int)fVar15 + (uint)!bVar5 * (int)fVar8);
  fVar15 = cosf(fVar7);
  fVar7 = sinf(fVar7);
  auVar32 = vinsertps_avx(ZEXT416((uint)(fVar8 * fVar15)),ZEXT416((uint)(fVar8 * fVar7)),0x10);
LAB_00351072:
  fVar8 = this->sceneRadius;
  fVar15 = this->scale;
  auVar35._8_4_ = 0x80000000;
  auVar35._0_8_ = 0x8000000080000000;
  auVar35._12_4_ = 0x80000000;
  auVar12._8_4_ = 0x3f800000;
  auVar12._0_8_ = 0x3f8000003f800000;
  auVar12._12_4_ = 0x3f800000;
  auVar9 = vfmadd132ss_fma(auVar16._0_16_,auVar12,ZEXT416(0xc0000000));
  fVar28 = auVar9._0_4_;
  auVar37._0_8_ = auVar9._0_8_ ^ 0x8000000080000000;
  auVar37._8_4_ = auVar9._8_4_ ^ 0x80000000;
  auVar37._12_4_ = auVar9._12_4_ ^ 0x80000000;
  auVar11 = vpternlogd_avx512vl(auVar37,auVar12,auVar35,0xec);
  auVar9 = vfnmadd231ss_fma(auVar12,auVar9,auVar9);
  auVar9 = vmaxss_avx(auVar9,ZEXT416(0) << 0x20);
  fVar36 = auVar11._0_4_;
  auVar9 = vsqrtss_avx(auVar9,auVar9);
  fVar20 = -1.0 / (fVar36 - fVar28);
  fVar14 = auVar9._0_4_ * fVar14;
  uVar1 = (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.x;
  uVar3 = (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.y;
  auVar9 = vinsertps_avx(auVar11,auVar9,0x1c);
  auVar39._0_4_ = -fVar14;
  auVar39._4_4_ = 0x80000000;
  auVar39._8_4_ = 0x80000000;
  auVar39._12_4_ = 0x80000000;
  auVar10 = vinsertps_avx(auVar39,auVar17._0_16_,0x1c);
  fVar21 = auVar9._0_4_ * auVar10._0_4_;
  fVar24 = auVar9._4_4_ * auVar10._4_4_;
  fVar25 = auVar9._8_4_ * auVar10._8_4_;
  fVar27 = auVar9._12_4_ * auVar10._12_4_;
  fVar4 = auVar32._0_4_;
  auVar22._0_4_ = fVar21 * fVar4;
  auVar22._4_4_ = fVar24 * auVar32._4_4_;
  auVar22._8_4_ = fVar25 * auVar32._8_4_;
  auVar22._12_4_ = fVar27 * auVar32._12_4_;
  auVar10 = vmovshdup_avx(auVar22);
  auVar26 = (undefined1  [56])0x0;
  fVar7 = (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.z;
  auVar19 = (undefined1  [56])0x0;
  SVar40 = DenselySampledSpectrum::Sample(&this->Lemit,lambda);
  auVar13 = _DAT_02865280;
  auVar23._0_8_ = SVar40.values.values._8_8_;
  auVar23._8_56_ = auVar26;
  auVar18._0_8_ = SVar40.values.values._0_8_;
  auVar18._8_56_ = auVar19;
  auVar6._4_4_ = fVar24;
  auVar6._0_4_ = fVar21;
  auVar6._8_4_ = fVar25;
  auVar6._12_4_ = fVar27;
  auVar9 = vmovlhps_avx(auVar18._0_16_,auVar23._0_16_);
  __return_storage_ptr__->set = true;
  auVar33 = vmovshdup_avx(auVar6);
  *(float *)&__return_storage_ptr__->optionalValue = auVar9._0_4_ * fVar15;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 4) = auVar9._4_4_ * fVar15;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 8) = auVar9._8_4_ * fVar15;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0xc) = auVar9._12_4_ * fVar15;
  fVar15 = fVar20 * fVar14 * auVar33._0_4_;
  auVar12 = vpermi2ps_avx512vl(auVar13,ZEXT416((uint)(fVar36 * fVar15)),ZEXT416((uint)fVar15));
  auVar9 = vshufps_avx(auVar32,auVar32,0xe1);
  auVar30._4_4_ = fVar20;
  auVar30._0_4_ = fVar20;
  auVar30._8_4_ = fVar20;
  auVar30._12_4_ = fVar20;
  auVar34._8_4_ = 0x3f800000;
  auVar34._0_8_ = 0x3f8000003f800000;
  auVar34._12_4_ = 0x3f800000;
  auVar29._0_4_ = fVar21 * auVar39._0_4_;
  auVar29._4_4_ = fVar24 * fVar24;
  auVar29._8_4_ = fVar25 * fVar25;
  auVar29._12_4_ = fVar27 * fVar27;
  auVar33 = vunpcklps_avx(auVar34,auVar11);
  auVar38._4_12_ = auVar6._4_12_;
  auVar38._0_4_ = fVar14;
  auVar33 = vfmadd231ps_fma(auVar33,auVar29,auVar30);
  auVar13._8_4_ = 0x80000000;
  auVar13._0_8_ = 0x8000000080000000;
  auVar13._12_4_ = 0x80000000;
  auVar13 = vmulps_avx512vl(auVar38,auVar13);
  auVar31._0_4_ = fVar14 * fVar8;
  auVar31._4_4_ = fVar24 * fVar8;
  auVar31._8_4_ = fVar25 * fVar8;
  auVar31._12_4_ = fVar27 * fVar8;
  auVar11._0_4_ =
       fVar8 * (auVar12._0_4_ * auVar9._0_4_ + fVar4 * auVar33._0_4_ + auVar13._0_4_) + (float)uVar1
  ;
  auVar11._4_4_ =
       fVar8 * (auVar12._4_4_ * auVar9._4_4_ + auVar32._4_4_ * auVar33._4_4_ + auVar13._4_4_) +
       (float)uVar3;
  auVar11._8_4_ =
       fVar8 * (auVar12._8_4_ * auVar9._8_4_ + auVar32._8_4_ * auVar33._8_4_ + auVar13._8_4_) + 0.0;
  auVar11._12_4_ =
       fVar8 * (auVar12._12_4_ * auVar9._12_4_ + auVar32._12_4_ * auVar33._12_4_ + auVar13._12_4_) +
       0.0;
  auVar32 = vsubps_avx(auVar11,auVar31);
  uVar2 = vmovlps_avx(auVar32);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar2;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) =
       (fVar8 * (fVar14 * fVar36 * fVar4 + auVar10._0_4_ + fVar28 * -0.0) + fVar7) - fVar28 * fVar8;
  uVar2 = vmovlps_avx(auVar38);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = uVar2;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x24) = fVar28;
  *(Float *)((long)&__return_storage_ptr__->optionalValue + 0x28) = time;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
  (__return_storage_ptr__->optionalValue).__data[0x88] = '\0';
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x90) =
       1.0 / (fVar8 * fVar8 * 3.1415927);
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x94) = 0x3da2f983;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightLeSample> UniformInfiniteLight::SampleLe(Point2f u1, Point2f u2,
                                                             SampledWavelengths &lambda,
                                                             Float time) const {
    // Sample direction for uniform infinite light ray
    Vector3f w = SampleUniformSphere(u1);

    // Compute infinite light sample ray
    Frame wFrame = Frame::FromZ(-w);
    Point2f cd = SampleUniformDiskConcentric(u2);
    Point3f pDisk = sceneCenter + sceneRadius * wFrame.FromLocal(Vector3f(cd.x, cd.y, 0));
    Ray ray(pDisk + sceneRadius * -w, w, time);

    // Compute probabilities for uniform infinite light
    Float pdfPos = 1 / (Pi * Sqr(sceneRadius));
    Float pdfDir = UniformSpherePDF();

    return LightLeSample(scale * Lemit.Sample(lambda), ray, pdfPos, pdfDir);
}